

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_b.h
# Opt level: O1

void arena_dalloc_large_no_tcache(tsdn_t *tsdn,void *ptr,szind_t szind)

{
  rtree_ctx_cache_elm_t *prVar1;
  void *pvVar2;
  rtree_leaf_elm_t *prVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  rtree_ctx_cache_elm_t *prVar7;
  rtree_ctx_cache_elm_t *prVar8;
  rtree_leaf_elm_t *prVar9;
  rtree_ctx_t *rtree_ctx;
  bool bVar10;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_198;
  
  rtree_ctx = &rStack_198;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_198);
  }
  else {
    rtree_ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar4 = (void *)((ulong)ptr & 0xffffffffc0000000);
  uVar5 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  prVar9 = (rtree_leaf_elm_t *)((long)&rtree_ctx->cache[0].leafkey + uVar5);
  pvVar2 = *(void **)((long)&rtree_ctx->cache[0].leafkey + uVar5);
  if (pvVar2 == pvVar4) {
    prVar9 = (rtree_leaf_elm_t *)
             ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + (long)prVar9[1].le_bits.repr);
  }
  else if ((void *)rtree_ctx->l2_cache[0].leafkey == pvVar4) {
    prVar3 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = (uintptr_t)pvVar2;
    rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar9[1].le_bits.repr;
    (prVar9->le_bits).repr = pvVar4;
    prVar9[1].le_bits.repr = prVar3;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar3->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    prVar7 = rtree_ctx->l2_cache + 1;
    if ((void *)rtree_ctx->l2_cache[1].leafkey == pvVar4) {
      uVar6 = 0;
      bVar10 = false;
    }
    else {
      uVar5 = 1;
      prVar8 = prVar7;
      do {
        uVar6 = uVar5;
        bVar10 = 6 < uVar6;
        if (uVar6 == 7) goto LAB_01dc109d;
        prVar7 = prVar8 + 1;
        prVar1 = prVar8 + 1;
        uVar5 = uVar6 + 1;
        prVar8 = prVar7;
      } while ((void *)prVar1->leafkey != pvVar4);
      bVar10 = 6 < uVar6;
    }
    prVar3 = prVar7->leaf;
    prVar7->leafkey = rtree_ctx->l2_cache[uVar6].leafkey;
    prVar7->leaf = rtree_ctx->l2_cache[uVar6].leaf;
    rtree_ctx->l2_cache[uVar6].leafkey = (uintptr_t)pvVar2;
    rtree_ctx->l2_cache[uVar6].leaf = (rtree_leaf_elm_t *)prVar9[1].le_bits.repr;
    (prVar9->le_bits).repr = pvVar4;
    prVar9[1].le_bits.repr = prVar3;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01dc109d:
    if (bVar10) {
      prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&duckdb_je_arena_emap_global.rtree,rtree_ctx,(uintptr_t)ptr,true,
                          false);
    }
  }
  duckdb_je_large_dalloc
            (tsdn,(edata_t *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80));
  return;
}

Assistant:

static inline void
arena_dalloc_large_no_tcache(tsdn_t *tsdn, void *ptr, szind_t szind) {
	if (config_prof && unlikely(szind < SC_NBINS)) {
		arena_dalloc_promoted(tsdn, ptr, NULL, true);
	} else {
		edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global,
		    ptr);
		if (large_dalloc_safety_checks(edata, ptr, szind)) {
			/* See the comment in isfree. */
			return;
		}
		large_dalloc(tsdn, edata);
	}
}